

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::addCols(HighsSparseMatrix *this,HighsSparseMatrix *new_cols,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  size_type sVar9;
  uint uVar10;
  HighsInt HVar11;
  MatrixFormat MVar12;
  int iVar13;
  HighsInt iNewCol;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  vector<int,_std::allocator<int>_> new_row_length;
  _Vector_base<int,_std::allocator<int>_> local_58;
  size_type local_40;
  value_type_conflict2 local_34;
  
  uVar2 = new_cols->num_col_;
  uVar10 = numNz(new_cols);
  if (uVar2 != 0) {
    iVar3 = this->num_col_;
    local_40 = (size_type)this->num_row_;
    HVar11 = numNz(this);
    MVar12 = this->format_;
    if (HVar11 < (int)uVar10 && MVar12 == kRowwise) {
      ensureColwise(this);
      MVar12 = this->format_;
    }
    iVar13 = HVar11 + uVar10;
    if (MVar12 == kColwise) {
      std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(int)(uVar2 + iVar3 + 1));
      uVar17 = 0;
      if (0 < (int)uVar2) {
        uVar17 = (ulong)uVar2;
      }
      piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = 0;
      if (uVar10 == 0) {
        for (; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          piVar5[(long)iVar3 + uVar14] = HVar11;
        }
      }
      else {
        for (; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          piVar5[(long)iVar3 + uVar14] =
               (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14] + HVar11;
        }
      }
      (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)(uVar2 + iVar3)] = iVar13;
      this->num_col_ = this->num_col_ + uVar2;
      if (0 < (int)uVar10) {
        std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar13);
        std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar13);
        piVar5 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar17 = 0; uVar10 != uVar17; uVar17 = uVar17 + 1) {
          piVar7[(long)HVar11 + uVar17] = piVar5[uVar17];
          pdVar8[(long)HVar11 + uVar17] = pdVar6[uVar17];
        }
      }
    }
    else {
      if (uVar10 != 0) {
        this_00 = &this->index_;
        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)iVar13);
        this_01 = &this->value_;
        std::vector<double,_std::allocator<double>_>::resize(this_01,(long)iVar13);
        sVar9 = local_40;
        local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_34 = 0;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  ((vector<int,_std::allocator<int>_> *)&local_58,local_40,&local_34);
        uVar14 = 0;
        uVar17 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar17 = uVar14;
        }
        for (; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          local_58._M_impl.super__Vector_impl_data._M_start
          [(new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14]] =
               local_58._M_impl.super__Vector_impl_data._M_start
               [(new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14]] + 1;
        }
        piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar16 = piVar5[sVar9];
        piVar5[sVar9] = iVar13;
        uVar17 = sVar9 & 0xffffffff;
        while (0 < (int)uVar17) {
          uVar17 = uVar17 - 1;
          iVar13 = local_58._M_impl.super__Vector_impl_data._M_start[uVar17];
          lVar15 = (long)(int)uVar10;
          uVar10 = uVar10 - iVar13;
          iVar4 = piVar5[uVar17];
          local_58._M_impl.super__Vector_impl_data._M_start[uVar17] = uVar10 + iVar16;
          piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar18 = (long)iVar16; iVar4 < lVar18; lVar18 = lVar18 + -1) {
            piVar7[(lVar15 + lVar18 + -1) - (long)iVar13] = piVar7[lVar18 + -1];
            pdVar6[(lVar15 + lVar18 + -1) - (long)iVar13] = pdVar6[lVar18 + -1];
          }
          piVar5[uVar17] = uVar10 + iVar4;
          iVar16 = iVar4;
        }
        uVar17 = 0;
        uVar14 = 0;
        if (0 < (int)uVar2) {
          uVar14 = (ulong)uVar2;
        }
        while (uVar17 != uVar14) {
          piVar5 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = uVar17 + 1;
          piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar13 = (int)uVar17;
          for (lVar15 = (long)piVar5[uVar17]; uVar17 = uVar1, lVar15 < piVar5[uVar1];
              lVar15 = lVar15 + 1) {
            iVar16 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15];
            piVar7[local_58._M_impl.super__Vector_impl_data._M_start[iVar16]] = iVar13 + iVar3;
            iVar4 = local_58._M_impl.super__Vector_impl_data._M_start[iVar16];
            pdVar6[iVar4] =
                 (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            local_58._M_impl.super__Vector_impl_data._M_start[iVar16] = iVar4 + 1;
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
      }
      this->num_col_ = this->num_col_ + uVar2;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::addCols(const HighsSparseMatrix new_cols,
                                const int8_t* in_partition) {
  assert(new_cols.isColwise());
  const HighsInt num_new_col = new_cols.num_col_;
  const HighsInt num_new_nz = new_cols.numNz();
  const vector<HighsInt>& new_matrix_start = new_cols.start_;
  const vector<HighsInt>& new_matrix_index = new_cols.index_;
  const vector<double>& new_matrix_value = new_cols.value_;

  assert(this->formatOk());
  // Adding columns to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  // Cannot handle the row-wise partitioned case
  assert(!partitioned);
  if (partitioned) {
    //    if (in_partition == NULL) { printf("in_partition == NULL\n"); }
    assert(in_partition != NULL);
  }
  assert(num_new_col >= 0);
  assert(num_new_nz >= 0);
  if (num_new_col == 0) {
    // No columns are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of columns to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no rows
  assert(num_new_nz <= 0 || num_row > 0);

  // If matrix is currently a standard row-wise matrix and there are
  // more new nonzeros than current nonzeros so flip column-wise
  if (this->format_ == MatrixFormat::kRowwise && num_new_nz > num_nz)
    this->ensureColwise();

  // Determine the new number of columns and nonzeros in the matrix
  HighsInt new_num_col = num_col + num_new_col;
  HighsInt new_num_nz = num_nz + num_new_nz;

  if (this->isColwise()) {
    // Matrix is column-wise
    this->start_.resize(new_num_col + 1);
    // Append the starts of the new columns
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz + new_matrix_start[iNewCol];
    } else {
      // No nonzeros being added, so new_matrix_start may be null, but entries
      // of zero are implied.
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz;
    }
    this->start_[num_col + num_new_col] = new_num_nz;
    // Update the number of columns
    this->num_col_ += num_new_col;
    // If no nonzeros are being added then there's nothing else to do
    if (num_new_nz <= 0) return;
    // Adding a non-trivial matrix: resize the column-wise matrix arrays
    // accordingly
    this->index_.resize(new_num_nz);
    this->value_.resize(new_num_nz);
    // Copy in the new indices and values
    for (HighsInt iEl = 0; iEl < num_new_nz; iEl++) {
      this->index_[num_nz + iEl] = new_matrix_index[iEl];
      this->value_[num_nz + iEl] = new_matrix_value[iEl];
    }
  } else {
    // Matrix is row-wise
    if (num_new_nz) {
      // Adding a positive number of nonzeros
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Determine the row lengths of the new columns being added
      std::vector<HighsInt> new_row_length;
      new_row_length.assign(num_row, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        new_row_length[new_matrix_index[iEl]]++;
      // Now shift the indices and values to make space
      HighsInt entry_offset = num_new_nz;
      HighsInt to_original_el = this->start_[num_row];
      this->start_[num_row] = new_num_nz;
      for (HighsInt iRow = num_row - 1; iRow >= 0; iRow--) {
        entry_offset -= new_row_length[iRow];
        HighsInt from_original_el = this->start_[iRow];
        // Can now use this new_row_length to store the start for the
        // new entries
        new_row_length[iRow] = to_original_el + entry_offset;
        for (HighsInt iEl = to_original_el - 1; iEl >= from_original_el;
             iEl--) {
          this->index_[iEl + entry_offset] = this->index_[iEl];
          this->value_[iEl + entry_offset] = this->value_[iEl];
        }
        to_original_el = from_original_el;
        this->start_[iRow] = entry_offset + from_original_el;
      }
      // Now insert the indices and values for the new columns
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++) {
        for (HighsInt iEl = new_matrix_start[iCol];
             iEl < new_matrix_start[iCol + 1]; iEl++) {
          HighsInt iRow = new_matrix_index[iEl];
          this->index_[new_row_length[iRow]] = num_col + iCol;
          this->value_[new_row_length[iRow]] = new_matrix_value[iEl];
          new_row_length[iRow]++;
        }
      }
    }
    // Have to increase the number of columns, even if no nonzeros are being
    // added
    this->num_col_ += num_new_col;
  }
}